

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.h
# Opt level: O2

void __thiscall
Js::DeferredTypeHandlerBase::DeferredTypeHandlerBase
          (DeferredTypeHandlerBase *this,DeferredTypeHandlerBase *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,&typeHandler->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01392568
  ;
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DeferredTypeHandler.h"
                                ,0x19,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) goto LAB_00a21a49;
    *puVar4 = 0;
  }
  bVar2 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler);
  bVar3 = DynamicTypeHandler::GetHasOnlyWritableDataProperties
                    (&typeHandler->super_DynamicTypeHandler);
  if (bVar2 != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DeferredTypeHandler.h"
                                ,0x1a,
                                "(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties())"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties()"
                               );
    if (!bVar2) {
LAB_00a21a49:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

DeferredTypeHandlerBase(DeferredTypeHandlerBase * typeHandler) : DynamicTypeHandler(typeHandler)
        {
            Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
            Assert(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties());
        }